

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

int Abc_NtkFinCheckTypesOk(Abc_Ntk_t *pNtk)

{
  void **ppvVar1;
  void *pvVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar5 = (long)pNtk->vObjs->nSize;
  if (0 < lVar5) {
    ppvVar1 = pNtk->vObjs->pArray;
    lVar4 = 0;
    do {
      pvVar2 = ppvVar1[lVar4];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        iVar3 = Abc_ObjFinGateType(*(Abc_Obj_t **)((long)pvVar2 + 0x38));
        if (iVar3 == -100) goto LAB_002b6ab1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar5 != lVar4);
  }
  lVar4 = 0;
LAB_002b6ab1:
  return (int)lVar4;
}

Assistant:

int Abc_NtkFinCheckTypesOk( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj; int i;
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_ObjFinGateType(pObj) == ABC_FIN_NONE )
            return i;
    return 0;
}